

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycled.hpp
# Opt level: O0

void __thiscall
Lib::
Recycled<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_**>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
::~Recycled(Recycled<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_**>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
            *this)

{
  bool bVar1;
  Stack<std::unique_ptr<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_**>_>_>_>
  *elem;
  long in_RDI;
  Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_**>
  *in_stack_ffffffffffffffa8;
  DefaultReset *in_stack_ffffffffffffffb0;
  Stack<std::unique_ptr<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_**>_>_>_>
  *in_stack_ffffffffffffffc0;
  unique_ptr<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_**>_>_>
  local_10 [2];
  
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_**>_>_>
                      *)0x3c3038);
  if (bVar1) {
    self((Recycled<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_**>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
          *)0x3c3057);
    bVar1 = DefaultKeepRecycled::operator()
                      ((DefaultKeepRecycled *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    if ((bVar1) &&
       ((Recycled<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node**>,Lib::DefaultReset,Lib::DefaultKeepRecycled>
         ::memAlive & 1) != 0)) {
      in_stack_ffffffffffffffc0 =
           (Stack<std::unique_ptr<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_**>_>_>_>
            *)(in_RDI + 8);
      self((Recycled<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_**>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
            *)0x3c309c);
      DefaultReset::operator()(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      elem = mem();
      std::
      unique_ptr<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_**>_>_>
      ::unique_ptr(local_10,(unique_ptr<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_**>_>_>
                             *)in_stack_ffffffffffffffa8);
      Stack<std::unique_ptr<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_**>_>_>_>
      ::push(in_stack_ffffffffffffffc0,
             (unique_ptr<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_**>_>_>
              *)elem);
      std::
      unique_ptr<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_**>_>_>
      ::~unique_ptr((unique_ptr<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_**>_>_>
                     *)in_stack_ffffffffffffffc0);
    }
  }
  std::
  unique_ptr<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_**>_>_>
  ::~unique_ptr((unique_ptr<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_**>_>_>
                 *)in_stack_ffffffffffffffc0);
  return;
}

Assistant:

~Recycled()
  {
    if (IF_USE_PTRS(_self, true) && _keep(self()) && memAlive) {
      _reset(self());
      mem().push(std::move(_self));
    }
  }